

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,LogFormat *logFormat)

{
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_0019b2d0;
  (this->m_userFormat)._M_dataplus._M_p = (pointer)&(this->m_userFormat).field_2;
  (this->m_userFormat)._M_string_length = 0;
  (this->m_userFormat).field_2._M_local_buf[0] = '\0';
  (this->m_format)._M_dataplus._M_p = (pointer)&(this->m_format).field_2;
  (this->m_format)._M_string_length = 0;
  (this->m_format).field_2._M_local_buf[0] = '\0';
  (this->m_dateTimeFormat)._M_dataplus._M_p = (pointer)&(this->m_dateTimeFormat).field_2;
  (this->m_dateTimeFormat)._M_string_length = 0;
  (this->m_dateTimeFormat).field_2._M_local_buf[0] = '\0';
  (this->m_currentUser)._M_dataplus._M_p = (pointer)&(this->m_currentUser).field_2;
  (this->m_currentUser)._M_string_length = 0;
  (this->m_currentUser).field_2._M_local_buf[0] = '\0';
  (this->m_currentHost)._M_dataplus._M_p = (pointer)&(this->m_currentHost).field_2;
  (this->m_currentHost)._M_string_length = 0;
  (this->m_currentHost).field_2._M_local_buf[0] = '\0';
  this->m_level = logFormat->m_level;
  std::__cxx11::string::operator=((string *)&this->m_userFormat,(string *)&logFormat->m_userFormat);
  std::__cxx11::string::operator=((string *)&this->m_format,(string *)&logFormat->m_format);
  std::__cxx11::string::operator=
            ((string *)&this->m_dateTimeFormat,(string *)&logFormat->m_dateTimeFormat);
  this->m_flags = logFormat->m_flags;
  std::__cxx11::string::operator=
            ((string *)&this->m_currentUser,(string *)&logFormat->m_currentUser);
  std::__cxx11::string::operator=
            ((string *)&this->m_currentHost,(string *)&logFormat->m_currentHost);
  return;
}

Assistant:

LogFormat::LogFormat(LogFormat&& logFormat) {
  m_level = std::move(logFormat.m_level);
  m_userFormat = std::move(logFormat.m_userFormat);
  m_format = std::move(logFormat.m_format);
  m_dateTimeFormat = std::move(logFormat.m_dateTimeFormat);
  m_flags = std::move(logFormat.m_flags);
  m_currentUser = std::move(logFormat.m_currentUser);
  m_currentHost = std::move(logFormat.m_currentHost);
}